

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O1

string * __thiscall
onmt::Tokenizer::mode_to_str_abi_cxx11_(string *__return_storage_ptr__,Tokenizer *this,Mode mode)

{
  invalid_argument *this_00;
  undefined4 in_register_00000014;
  char *pcVar1;
  char *pcVar2;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "conservative";
    pcVar1 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "aggressive";
    pcVar1 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "char";
    pcVar1 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "space";
    pcVar1 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "none";
    pcVar1 = "";
    break;
  default:
    this_00 = (invalid_argument *)
              __cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,mode));
    std::invalid_argument::invalid_argument(this_00,"invalid tokenization mode");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::mode_to_str(const Mode mode)
  {
    switch (mode)
    {
    case Mode::Aggressive:
      return "aggressive";
    case Mode::Char:
      return "char";
    case Mode::Conservative:
      return "conservative";
    case Mode::None:
      return "none";
    case Mode::Space:
      return "space";
    }
    throw std::invalid_argument("invalid tokenization mode");
  }